

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bezier.h
# Opt level: O1

TightBoundingBox * __thiscall
bezier::Bezier<3UL>::tbb(TightBoundingBox *__return_storage_ptr__,Bezier<3UL> *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  uint extraout_XMM0_Dd;
  Bezier<3UL> bezier;
  Vec2 translation;
  ExtremePoints local_90;
  Bezier<3UL> local_78;
  undefined4 local_38;
  uint uStack_34;
  uint uStack_2c;
  Vec2 local_28;
  
  dVar2 = (this->mControlPoints)._M_elems[3].x;
  dVar3 = (this->mControlPoints)._M_elems[3].y;
  local_78.mControlPoints._M_elems[3].x = dVar2;
  dVar2 = local_78.mControlPoints._M_elems[3].x;
  local_78.mControlPoints._M_elems[3].y = dVar3;
  local_78.mControlPoints._M_elems[2].x = (this->mControlPoints)._M_elems[2].x;
  local_78.mControlPoints._M_elems[2].y = (this->mControlPoints)._M_elems[2].y;
  local_78.mControlPoints._M_elems[1].x = (this->mControlPoints)._M_elems[1].x;
  local_78.mControlPoints._M_elems[1].y = (this->mControlPoints)._M_elems[1].y;
  local_78.mControlPoints._M_elems[0].x = (this->mControlPoints)._M_elems[0].x;
  local_78.mControlPoints._M_elems[0].y = (this->mControlPoints)._M_elems[0].y;
  local_78.mControlPoints._M_elems[3].x._0_4_ = SUB84(dVar2,0);
  local_78.mControlPoints._M_elems[3].x._4_4_ = (uint)((ulong)dVar2 >> 0x20);
  local_28.x._4_4_ = local_78.mControlPoints._M_elems[3].x._4_4_ ^ 0x80000000;
  local_28.y._4_4_ = (uint)((ulong)dVar3 >> 0x20) ^ 0x80000000;
  local_28.y._0_4_ = SUB84(dVar3,0);
  local_28.x._0_4_ = local_78.mControlPoints._M_elems[3].x._0_4_;
  lVar4 = 8;
  local_78.mControlPoints._M_elems[3].x = dVar2;
  do {
    dVar1 = *(double *)((long)&local_78.mControlPoints._M_elems[0].x + lVar4);
    *(double *)((long)local_78.mControlPoints._M_elems + lVar4 + -8) =
         *(double *)((long)local_78.mControlPoints._M_elems + lVar4 + -8) - dVar2;
    *(double *)((long)&local_78.mControlPoints._M_elems[0].x + lVar4) = dVar1 - dVar3;
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x48);
  dVar2 = atan2(local_78.mControlPoints._M_elems[0].y,local_78.mControlPoints._M_elems[0].x);
  local_38 = SUB84(dVar2,0);
  uStack_34 = (uint)((ulong)dVar2 >> 0x20) ^ 0x80000000;
  uStack_2c = extraout_XMM0_Dd ^ 0x80000000;
  rotate(&local_78,-dVar2,(Vec2)(ZEXT816(0) << 0x40));
  extremePoints(&local_90,&local_78);
  TightBoundingBox::TightBoundingBox
            (__return_storage_ptr__,&local_90,&local_28,(double)CONCAT44(uStack_34,local_38));
  if (local_90.points.super__Vector_base<bezier::Vec2,_std::allocator<bezier::Vec2>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.points.super__Vector_base<bezier::Vec2,_std::allocator<bezier::Vec2>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.points.
                          super__Vector_base<bezier::Vec2,_std::allocator<bezier::Vec2>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.points.
                          super__Vector_base<bezier::Vec2,_std::allocator<bezier::Vec2>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

TightBoundingBox tbb() const
        {
            Bezier<N> bezier = *this;

            // Translate last control point (highest order) to origo.
            Vec2 translation(-bezier[N]);
            bezier.translate(translation);

            // Rotate bezier to align the first control point (lowest order) with the x-axis
            double angle = -bezier[0].angle();
            bezier.rotate(angle);

            return TightBoundingBox(bezier.extremePoints(), translation, angle);
        }